

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.cpp
# Opt level: O2

int duckdb_zstd::ZSTD_shouldAttachDict
              (ZSTD_CDict *cdict,ZSTD_CCtx_params *params,U64 pledgedSrcSize)

{
  if ((cdict->matchState).dedicatedDictSearch != 0) {
    return 1;
  }
  if ((pledgedSrcSize == 0xffffffffffffffff) ||
     (pledgedSrcSize <=
      *(ulong *)(attachDictSizeCutoffs + (ulong)(cdict->matchState).cParams.strategy * 8))) {
    if (params->attachDictPref != ZSTD_dictForceCopy) goto LAB_01f60762;
  }
  else if (params->attachDictPref == ZSTD_dictForceAttach) {
LAB_01f60762:
    return (uint)(params->forceWindow == 0);
  }
  return 0;
}

Assistant:

static int ZSTD_shouldAttachDict(const ZSTD_CDict* cdict,
                                 const ZSTD_CCtx_params* params,
                                 U64 pledgedSrcSize)
{
    size_t cutoff = attachDictSizeCutoffs[cdict->matchState.cParams.strategy];
    int const dedicatedDictSearch = cdict->matchState.dedicatedDictSearch;
    return dedicatedDictSearch
        || ( ( pledgedSrcSize <= cutoff
            || pledgedSrcSize == ZSTD_CONTENTSIZE_UNKNOWN
            || params->attachDictPref == ZSTD_dictForceAttach )
          && params->attachDictPref != ZSTD_dictForceCopy
          && !params->forceWindow ); /* dictMatchState isn't correctly
                                      * handled in _enforceMaxDist */
}